

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O2

unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
__thiscall ninx::parser::element::Block::make_empty(Block *this,Block *parent)

{
  _func_int **pp_Var1;
  vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
  block_statements;
  vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
  local_28;
  
  local_28.
  super__Vector_base<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.
  super__Vector_base<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.
  super__Vector_base<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  make_unique<ninx::parser::element::Block,std::vector<std::unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>,std::allocator<std::unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>>>>
            ((vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
              *)this);
  pp_Var1 = (this->super_Expression).super_Statement.super_ASTElement._vptr_ASTElement;
  (**(code **)(*pp_Var1 + 0x20))(pp_Var1,parent);
  std::
  vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
  ::~vector(&local_28);
  return (__uniq_ptr_data<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>,_true,_true>
          )(__uniq_ptr_data<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<ninx::parser::element::Block>
ninx::parser::element::Block::make_empty(ninx::parser::element::Block *parent) {
    std::vector<std::unique_ptr<Statement>> block_statements;
    auto block{std::make_unique<Block>(std::move(block_statements))};
    block->set_parent(parent);

    return block;
}